

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

AssertionItemPortListSyntax * __thiscall
slang::parsing::Parser::parseAssertionItemPortList(Parser *this,SyntaxKind parentKind)

{
  bool bVar1;
  int iVar2;
  AssertionItemPortSyntax *pAVar3;
  undefined4 extraout_var;
  AssertionItemPortListSyntax *pAVar4;
  Info *extraout_RDX;
  Info *pIVar5;
  TokenKind TVar6;
  TokenKind TVar7;
  Token TVar8;
  Token TVar9;
  Token openParen;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  Token local_100;
  Info *local_f0;
  undefined8 local_e8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_e0;
  ulong local_d0;
  undefined8 uStack_c8;
  undefined8 local_b8;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_a8 [2];
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (!bVar1) {
    return (AssertionItemPortListSyntax *)0x0;
  }
  TVar8 = ParserBase::consume(&this->super_ParserBase);
  local_f0 = TVar8.info;
  local_e8 = TVar8._0_8_;
  local_a8[0].data_ = (pointer)local_a8[0].firstElement;
  local_a8[0].len = 0;
  local_a8[0].cap = 4;
  Token::Token(&local_100);
  TVar8 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8.kind);
  if (bVar1) {
    local_100 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossiblePropertyPortItem(TVar8.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar8,CloseParenthesis,&local_100,(DiagCode)0x2e0005);
      pIVar5 = extraout_RDX;
      goto LAB_00679ac5;
    }
    do {
      pIVar5 = TVar8.info;
      pAVar3 = parseAssertionItemPort(this,parentKind);
      local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pAVar3;
      local_d0 = CONCAT71(local_d0._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_a8,(TokenOrSyntax *)&local_e0._M_first);
      TVar9 = ParserBase::peek(&this->super_ParserBase);
      TVar6 = TVar9.kind;
      bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar6);
      if (TVar6 == EndOfFile || bVar1) break;
      if (TVar6 != Comma) {
        ParserBase::expect(&this->super_ParserBase,Comma);
        do {
          bVar1 = ParserBase::
                  skipBadTokens<&slang::syntax::SyntaxFacts::isPossiblePropertyPortItem,&slang::syntax::SyntaxFacts::isEndOfParenList>
                            (&this->super_ParserBase,(DiagCode)0x2e0005,false);
          if (!bVar1) {
            local_100 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
            goto LAB_00679abb;
          }
          bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
        } while (!bVar1);
      }
      local_e0._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)
           ParserBase::expect(&this->super_ParserBase,Comma);
      local_d0 = local_d0 & 0xffffffffffffff00;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_a8,(TokenOrSyntax *)&local_e0._M_first);
      TVar9 = ParserBase::peek(&this->super_ParserBase);
      TVar6 = TVar9.kind;
      bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar6);
      if (TVar6 == EndOfFile || bVar1) {
        ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
        break;
      }
      TVar7 = TVar8.kind;
      TVar8 = TVar9;
    } while ((pIVar5 != TVar9.info || TVar7 != TVar6) ||
            (bVar1 = ParserBase::
                     skipBadTokens<&slang::syntax::SyntaxFacts::isPossiblePropertyPortItem,&slang::syntax::SyntaxFacts::isEndOfParenList>
                               (&this->super_ParserBase,(DiagCode)0x2e0005,true), bVar1));
    local_100 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  }
LAB_00679abb:
  pIVar5 = local_100.info;
LAB_00679ac5:
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_a8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar5)
  ;
  local_b8 = CONCAT44(extraout_var,iVar2);
  local_e0._8_4_ = 3;
  local_d0 = 0;
  uStack_c8 = 0;
  local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_00c94bf8;
  openParen.info = local_f0;
  openParen.kind = (undefined2)local_e8;
  openParen._2_1_ = local_e8._2_1_;
  openParen.numFlags.raw = local_e8._3_1_;
  openParen.rawLen = local_e8._4_4_;
  pAVar4 = slang::syntax::SyntaxFactory::assertionItemPortList
                     (&this->factory,openParen,
                      (SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *)
                      &local_e0._M_first,local_100);
  if (local_a8[0].data_ != (pointer)local_a8[0].firstElement) {
    operator_delete(local_a8[0].data_);
  }
  return pAVar4;
}

Assistant:

AssertionItemPortListSyntax* Parser::parseAssertionItemPortList(SyntaxKind parentKind) {
    if (!peek(TokenKind::OpenParenthesis))
        return nullptr;

    auto openParen = consume();

    SmallVector<TokenOrSyntax, 4> buffer;
    Token closeParen;
    parseList<isPossiblePropertyPortItem, isEndOfParenList>(
        buffer, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen, RequireItems::False,
        diag::ExpectedAssertionItemPort,
        [this, parentKind] { return &parseAssertionItemPort(parentKind); });

    return &factory.assertionItemPortList(openParen, buffer.copy(alloc), closeParen);
}